

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O1

void glfwSetJoystickUserPointer(int jid,void *pointer)

{
  undefined8 in_RAX;
  undefined8 in_RDX;
  
  if (jid < 0) {
    __assert_fail("jid >= GLFW_JOYSTICK_1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/vendor/glfw/src/input.c"
                  ,0x45e,"void glfwSetJoystickUserPointer(int, void *)");
  }
  if (jid < 0x10) {
    if (_glfw.initialized != 0) {
      if (_glfw.joysticks[(uint)jid].present != 0) {
        _glfw.joysticks[(uint)jid].userPointer = pointer;
      }
      return;
    }
    _glfwInputError(0x10001,(char *)0x0,in_RDX,in_RAX);
    return;
  }
  __assert_fail("jid <= GLFW_JOYSTICK_LAST",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/vendor/glfw/src/input.c"
                ,0x45f,"void glfwSetJoystickUserPointer(int, void *)");
}

Assistant:

GLFWAPI void glfwSetJoystickUserPointer(int jid, void* pointer)
{
    _GLFWjoystick* js;

    assert(jid >= GLFW_JOYSTICK_1);
    assert(jid <= GLFW_JOYSTICK_LAST);

    _GLFW_REQUIRE_INIT();

    js = _glfw.joysticks + jid;
    if (!js->present)
        return;

    js->userPointer = pointer;
}